

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool checkInterfacePropertyCompatibility<bool>
               (cmTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  string *this;
  bool bVar1;
  bool bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *pmVar3;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *this_00;
  string *psVar4;
  reference ppcVar5;
  ostream *poVar6;
  char *pcVar7;
  byte local_702;
  byte local_701;
  string local_700;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  string local_6a0 [32];
  undefined1 local_680 [8];
  ostringstream e_2;
  string local_508;
  pair<bool,_bool> local_4e2;
  string local_4e0 [6];
  pair<bool,_bool> consistent_2;
  undefined1 local_4c0 [8];
  ostringstream e_1;
  string local_348;
  pair<bool,_bool> local_326;
  int local_324;
  string local_320 [2];
  pair<bool,_bool> consistent_1;
  undefined1 local_300 [8];
  ostringstream e;
  string local_188;
  pair<bool,_bool> local_162;
  undefined1 local_160 [6];
  pair<bool,_bool> consistent;
  undefined1 local_140 [8];
  string reportEntry;
  iterator iStack_118;
  bool ifacePropContent;
  _Self local_110;
  byte local_101;
  cmTarget *pcStack_100;
  bool ifaceIsSet;
  cmTarget *theTarget;
  __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
  local_f0;
  const_iterator li;
  string interfaceProperty;
  allocator local_91;
  undefined1 local_90 [8];
  string report;
  bool propInitialized;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *deps;
  iterator iStack_58;
  bool impliedByUse;
  _Self local_50;
  byte local_42;
  byte local_41;
  bool explicitlySet;
  bool *pbStack_40;
  bool propContent;
  bool *param_5_local;
  char *pcStack_30;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmTarget *tgt_local;
  
  pbStack_40 = param_6;
  param_5_local._4_4_ = t;
  pcStack_30 = defaultValue;
  defaultValue_local = (char *)config;
  config_local = p;
  p_local = (string *)tgt;
  local_41 = getTypedProperty<bool>(tgt,p);
  pmVar3 = &cmTarget::GetProperties((cmTarget *)p_local)->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ::find(pmVar3,config_local);
  pmVar3 = &cmTarget::GetProperties((cmTarget *)p_local)->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  iStack_58 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::end(pmVar3);
  local_42 = std::operator!=(&local_50,&stack0xffffffffffffffa8);
  bVar1 = cmTarget::IsNullImpliedByLinkLibraries((cmTarget *)p_local,config_local);
  local_701 = 1;
  if (bVar1 == (bool)(local_42 & 1)) {
    local_702 = 0;
    if (!bVar1) {
      local_702 = local_42 ^ 0xff;
    }
    local_701 = local_702;
  }
  if ((local_701 & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1314,
                  "PropertyType checkInterfacePropertyCompatibility(const cmTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  this_00 = cmTarget::GetLinkImplementationClosure((cmTarget *)p_local,(string *)defaultValue_local)
  ;
  bVar2 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::empty(this_00);
  if (bVar2) {
    tgt_local._7_1_ = local_41 & 1;
  }
  else {
    report.field_2._M_local_buf[0xf] = local_42 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_90," * Target \"",&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
    std::__cxx11::string::operator+=((string *)local_90,(string *)psVar4);
    if ((local_42 & 1) == 0) {
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_90,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_90,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_90,"\" has property content \"");
      valueAsString<bool>((string *)((long)&interfaceProperty.field_2 + 8),(bool)(local_41 & 1));
      std::__cxx11::string::operator+=
                ((string *)local_90,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_90,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li,
                   "INTERFACE_",config_local);
    local_f0._M_current =
         (cmTarget **)
         std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::begin(this_00);
    while( true ) {
      theTarget = (cmTarget *)
                  std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::end(this_00);
      bVar2 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
                          *)&theTarget);
      if (!bVar2) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
                ::operator*(&local_f0);
      pcStack_100 = *ppcVar5;
      pmVar3 = &cmTarget::GetProperties(pcStack_100)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ;
      local_110._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ::find(pmVar3,(key_type *)&li);
      pmVar3 = &cmTarget::GetProperties(pcStack_100)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ;
      iStack_118 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                   ::end(pmVar3);
      local_101 = std::operator!=(&local_110,&stack0xfffffffffffffee8);
      reportEntry.field_2._M_local_buf[0xf] = getTypedProperty<bool>(pcStack_100,(string *)&li);
      std::__cxx11::string::string((string *)local_140);
      if ((local_101 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_140," * Target \"");
        psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_100);
        std::__cxx11::string::operator+=((string *)local_140,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_140,"\" property value \"");
        valueAsString<bool>((string *)local_160,(bool)(reportEntry.field_2._M_local_buf[0xf] & 1));
        std::__cxx11::string::operator+=((string *)local_140,(string *)local_160);
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::operator+=((string *)local_140,"\" ");
      }
      if ((local_42 & 1) == 0) {
        if (bVar1) {
          local_41 = impliedValue<bool>((bool)(local_41 & 1));
          if ((local_101 & 1) == 0) {
            local_324 = 4;
          }
          else {
            local_326 = consistentProperty<bool>
                                  ((bool)local_41,(bool)(reportEntry.field_2._M_local_buf[0xf] & 1),
                                   param_5_local._4_4_);
            std::__cxx11::string::operator+=((string *)local_90,(string *)local_140);
            compatibilityAgree_abi_cxx11_
                      (&local_348,param_5_local._4_4_,(local_41 & 1) != (local_326.second & 1U));
            std::__cxx11::string::operator+=((string *)local_90,(string *)&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            if (((ushort)local_326 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
              poVar6 = std::operator<<((ostream *)local_4c0,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)config_local);
              poVar6 = std::operator<<(poVar6," on target \"");
              psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,pcStack_30);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)config_local);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_100);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string(local_4e0);
              local_324 = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
            }
            else {
              local_41 = local_326.second & 1;
              local_324 = 4;
            }
          }
        }
        else if ((local_101 & 1) == 0) {
          local_324 = 4;
        }
        else if ((report.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::operator+(&local_6c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_90,(string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6c0);
          local_41 = reportEntry.field_2._M_local_buf[0xf] & 1;
          report.field_2._M_local_buf[0xf] = '\x01';
          local_324 = 0;
        }
        else {
          local_4e2 = consistentProperty<bool>
                                ((bool)(local_41 & 1),
                                 (bool)(reportEntry.field_2._M_local_buf[0xf] & 1),
                                 param_5_local._4_4_);
          std::__cxx11::string::operator+=((string *)local_90,(string *)local_140);
          compatibilityAgree_abi_cxx11_
                    (&local_508,param_5_local._4_4_,(local_41 & 1) != (local_4e2.second & 1U));
          std::__cxx11::string::operator+=((string *)local_90,(string *)&local_508);
          std::__cxx11::string::~string((string *)&local_508);
          if (((ushort)local_4e2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_680);
            poVar6 = std::operator<<((ostream *)local_680,"The INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)config_local);
            poVar6 = std::operator<<(poVar6," property of \"");
            psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_100);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
            poVar6 = std::operator<<(poVar6,(string *)config_local);
            poVar6 = std::operator<<(poVar6," already determined\nfor \"");
            psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_6a0);
            local_324 = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_680);
          }
          else {
            local_41 = local_4e2.second & 1;
            local_324 = 4;
          }
        }
      }
      else if ((local_101 & 1) == 0) {
        local_324 = 4;
      }
      else {
        local_162 = consistentProperty<bool>
                              ((bool)(local_41 & 1),
                               (bool)(reportEntry.field_2._M_local_buf[0xf] & 1),param_5_local._4_4_
                              );
        std::__cxx11::string::operator+=((string *)local_90,(string *)local_140);
        compatibilityAgree_abi_cxx11_
                  (&local_188,param_5_local._4_4_,(local_41 & 1) != (local_162.second & 1U));
        std::__cxx11::string::operator+=((string *)local_90,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        if (((ushort)local_162 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
          poVar6 = std::operator<<((ostream *)local_300,"Property ");
          poVar6 = std::operator<<(poVar6,(string *)config_local);
          poVar6 = std::operator<<(poVar6," on target \"");
          psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)p_local);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
          poVar6 = std::operator<<(poVar6,(string *)config_local);
          poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
          psVar4 = cmTarget::GetName_abi_cxx11_(pcStack_100);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          std::operator<<(poVar6,"\".\n");
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string(local_320);
          local_324 = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
        }
        else {
          local_41 = local_162.second & 1;
          local_324 = 4;
        }
      }
      std::__cxx11::string::~string((string *)local_140);
      if ((local_324 != 0) && (local_324 == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
      ::operator++(&local_f0);
    }
    this = p_local;
    psVar4 = config_local;
    valueAsString<bool>(&local_6e0,(bool)(local_41 & 1));
    compatibilityType_abi_cxx11_(&local_700,param_5_local._4_4_);
    cmTarget::ReportPropertyOrigin((cmTarget *)this,psVar4,&local_6e0,(string *)local_90,&local_700)
    ;
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_6e0);
    tgt_local._7_1_ = local_41 & 1;
    local_324 = 1;
    std::__cxx11::string::~string((string *)&li);
    std::__cxx11::string::~string((string *)local_90);
  }
  return (bool)(tgt_local._7_1_ & 1);
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  const bool explicitlySet = tgt->GetProperties()
                                  .find(p)
                                  != tgt->GetProperties().end();
  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmTarget const* theTarget = *li;

    const bool ifaceIsSet = theTarget->GetProperties()
                            .find(interfaceProperty)
                            != theTarget->GetProperties().end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}